

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::Stage::GetPrimAtPath_abi_cxx11_
          (expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Stage *this,Path *path)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  Prim *pPVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  iterator iVar8;
  storage_t<const_tinyusdz::Prim_*> *psVar9;
  long *plVar10;
  long *plVar11;
  value_type pPVar12;
  Prim *parent;
  string local_c0;
  value_type local_a0;
  storage_t<const_tinyusdz::Prim_*> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  *local_80;
  storage_t<const_tinyusdz::Prim_*> local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  if (path->_valid == false) {
    local_c0._M_dataplus._M_p = "Path is invalid.\n";
  }
  else {
    sVar3 = (path->_prim_part)._M_string_length;
    if ((sVar3 == 0) || (*(path->_prim_part)._M_dataplus._M_p != '/')) {
      local_c0._M_dataplus._M_p = "Relative path is TODO.\n";
    }
    else {
      if ((sVar3 != 0) && (*(path->_prim_part)._M_dataplus._M_p == '/')) {
        this_00 = &this->_prim_path_cache;
        if (this->_dirty == true) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                      *)this_00,
                     (_Link_type)
                     (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                    );
          p_Var1 = &(this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header;
          (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var1->_M_header;
          (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var1->_M_header;
          (this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          this->_dirty = false;
        }
        else {
          iVar8 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  ::find(&this_00->_M_t,(key_type *)path);
          if ((_Rb_tree_header *)iVar8._M_node !=
              &(this->_prim_path_cache)._M_t._M_impl.super__Rb_tree_header) {
            (__return_storage_ptr__->contained).
            super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = true;
            (__return_storage_ptr__->contained).
            super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value = *(value_type *)(iVar8._M_node + 2);
            return __return_storage_ptr__;
          }
        }
        parent = (this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar4 = (this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_80 = this_00;
        do {
          bVar6 = parent != pPVar4;
          if (!bVar6) {
LAB_0031192e:
            Path::full_path_name_abi_cxx11_(&local_50,path);
            plVar10 = (long *)::std::__cxx11::string::replace
                                        ((ulong)&local_50,0,(char *)0x0,0x3c746a);
            plVar11 = plVar10 + 2;
            if ((long *)*plVar10 == plVar11) {
              local_60 = *plVar11;
              lStack_58 = plVar10[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *plVar11;
              local_70 = (long *)*plVar10;
            }
            local_68 = plVar10[1];
            *plVar10 = (long)plVar11;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)::std::__cxx11::string::append((char *)&local_70);
            pPVar12 = (value_type)(plVar10 + 2);
            if ((value_type)*plVar10 == pPVar12) {
              local_90._M_allocated_capacity =
                   (size_type)(pPVar12->_abs_path)._prim_part._M_dataplus._M_p;
              local_90._8_8_ = plVar10[3];
              local_a0 = (value_type)&local_90;
            }
            else {
              local_90._M_allocated_capacity =
                   (size_type)(pPVar12->_abs_path)._prim_part._M_dataplus._M_p;
              local_a0 = (value_type)*plVar10;
            }
            local_c0.field_2._M_allocated_capacity = local_90._M_allocated_capacity;
            sVar5 = plVar10[1];
            *plVar10 = (long)pPVar12;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            paVar2 = &local_c0.field_2;
            if (local_a0 == (value_type)&local_90) {
              local_c0.field_2._8_8_ = local_90._8_8_;
              local_c0._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_c0._M_dataplus._M_p = (pointer)local_a0;
            }
            local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffffffffff00;
            (__return_storage_ptr__->contained).
            super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = false;
            pPVar12 = (value_type)
                      ((long)&(__return_storage_ptr__->contained).
                              super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
            (__return_storage_ptr__->contained).
            super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value = pPVar12;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p == paVar2) {
              (pPVar12->_abs_path)._prim_part._M_dataplus._M_p =
                   (pointer)local_c0.field_2._M_allocated_capacity;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->contained).
                       super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0 + 0x18) = local_c0.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->contained).
              super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_value = (value_type)local_c0._M_dataplus._M_p;
              *(size_type *)
               ((long)&(__return_storage_ptr__->contained).
                       super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0 + 0x10) = local_c0.field_2._M_allocated_capacity;
            }
            (__return_storage_ptr__->contained).
            super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_string_length = sVar5;
            local_c0.field_2._M_allocated_capacity =
                 local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_98 = (storage_t<const_tinyusdz::Prim_*>)0x0;
            local_c0._M_string_length = 0;
            local_c0._M_dataplus._M_p = (pointer)paVar2;
            local_a0 = (value_type)&local_90;
            if (local_70 != &local_60) {
              operator_delete(local_70,local_60 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return __return_storage_ptr__;
            }
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            return __return_storage_ptr__;
          }
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
          anon_unknown_28::GetPrimAtPathRec
                    ((optional<const_tinyusdz::Prim_*> *)&local_a0,parent,&local_c0,path,0);
          bVar7 = local_a0._0_1_;
          if (local_a0._0_1_ != false) {
            local_78 = local_98;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if (bVar7 != false) {
            psVar9 = (storage_t<const_tinyusdz::Prim_*> *)
                     ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                     ::operator[](local_80,(key_type *)path);
            *psVar9 = local_78;
            (__return_storage_ptr__->contained).
            super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = true;
            (__return_storage_ptr__->contained).
            super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_value = (value_type)local_78;
            if (bVar6) {
              return __return_storage_ptr__;
            }
            goto LAB_0031192e;
          }
          parent = parent + 1;
        } while( true );
      }
      local_c0._M_dataplus._M_p = "Path is not absolute. Non-absolute Path is TODO.\n";
    }
  }
  nonstd::expected_lite::
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<const Prim *, std::string> Stage::GetPrimAtPath(
    const Path &path) const {
  DCOUT("GetPrimAtPath : " << path.prim_part() << "(input path: " << path
                           << ")");

  if (!path.is_valid()) {
    DCOUT("Invalid path.");
    return nonstd::make_unexpected("Path is invalid.\n");
  }

  if (path.is_relative_path()) {
    DCOUT("Relative path is todo.");
    // TODO:
    return nonstd::make_unexpected("Relative path is TODO.\n");
  }

  if (!path.is_absolute_path()) {
    DCOUT("Not absolute path.");
    return nonstd::make_unexpected(
        "Path is not absolute. Non-absolute Path is TODO.\n");
  }

  if (_dirty) {
    DCOUT("clear cache.");
    // Clear cache.
    _prim_path_cache.clear();

    _dirty = false;
  } else {
    // First find from a cache.
    auto ret = _prim_path_cache.find(path.prim_part());
    if (ret != _prim_path_cache.end()) {
      DCOUT("Found cache.");
      return ret->second;
    }
  }


  // Brute-force search.
  for (const auto &parent : _root_nodes) {
    if (auto pv =
            GetPrimAtPathRec(&parent, /* root */ "", path, /* depth */ 0)) {
      // Add to cache.
      // Assume pointer address does not change unless dirty state.
      _prim_path_cache[path.prim_part()] = pv.value();
      return pv.value();
    }
  }

  DCOUT("Not found.");
  return nonstd::make_unexpected("Cannot find path <" + path.full_path_name() +
                                 "> in the Stage.\n");
}